

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void __thiscall icu_63::PluralRuleParser::checkSyntax(PluralRuleParser *this,UErrorCode *status)

{
  tokenType tVar1;
  uint uVar2;
  
  if (U_ZERO_ERROR < *status) {
    return;
  }
  tVar1 = this->prevType;
  if ((tVar1 != none) && (tVar1 != tSemiColon)) {
    tVar1 = getKeyType(&this->token,this->type);
    this->type = tVar1;
    tVar1 = this->prevType;
  }
  switch(tVar1) {
  case none:
  case tSemiColon:
    if (this->type == tKeyword) {
      return;
    }
    if (this->type == tEOF) {
      return;
    }
    break;
  case tNumber:
    tVar1 = this->type;
    if (tEOF < tVar1) break;
    uVar2 = 0x101bd94c;
    goto LAB_0026b7cb;
  case tComma:
  case tDot2:
  case tMod:
  case tIn:
  case tEqual:
  case tNotEqual:
  case tWithin:
    if (this->type == tNumber) {
      return;
    }
    break;
  case tColon:
    tVar1 = this->type;
    if (tVariableT < tVar1) break;
    uVar2 = 0x3e00040;
    goto LAB_0026b7cb;
  case tAt:
    if ((this->type & ~tNumber) == tDecimal) {
      return;
    }
    break;
  case tKeyword:
    if (this->type == tColon) {
      return;
    }
    break;
  case tAnd:
  case tOr:
    if (this->type - tVariableN < 5) {
      return;
    }
    break;
  case tNot:
    tVar1 = this->type;
    if (tWithin < tVar1) break;
    uVar2 = 0x88002;
    goto LAB_0026b7cb;
  case tIs:
    if (this->type == tNumber) {
      return;
    }
    if (this->type == tNot) {
      return;
    }
    break;
  case tVariableN:
  case tVariableI:
  case tVariableF:
  case tVariableV:
  case tVariableT:
    tVar1 = this->type;
    if (tIs < tVar1) break;
    uVar2 = 0x1be000;
LAB_0026b7cb:
    if ((uVar2 >> (tVar1 & (tEOF|tSemiColon)) & 1) != 0) {
      return;
    }
  }
  *status = U_FMT_PARSE_ERROR_START;
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }